

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLT.h
# Opt level: O3

LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> * __thiscall
Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::compute
          (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this,MatrixType *a)

{
  ulong nbRows;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  undefined8 *puVar4;
  
  nbRows = (a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (nbRows != (a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols) {
    __assert_fail("a.rows()==a.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chrisgundling[P]Udacity-T2P2-UnscentedKalmanFilter/src/Eigen/src/Cholesky/LLT.h"
                  ,0x18b,
                  "LLT<MatrixType, _UpLo> &Eigen::LLT<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &) [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                 );
  }
  if (-1 < (long)nbRows) {
    if ((nbRows != 0) &&
       (auVar1._8_8_ = 0, auVar1._0_8_ = nbRows,
       auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff), SUB168(auVar2 / auVar1,0) < nbRows
       )) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8,a,SUB168(auVar2 % auVar1,0));
      *puVar4 = operator_delete;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)this,nbRows * nbRows,nbRows,nbRows);
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)a);
    this->m_isInitialized = true;
    IVar3 = internal::llt_inplace<double,1>::blocked<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      (&this->m_matrix);
    this->m_info = (uint)(IVar3 != -1);
    return this;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/chrisgundling[P]Udacity-T2P2-UnscentedKalmanFilter/src/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

static typename MatrixType::Index blocked(MatrixType& m)
  {
    typedef typename MatrixType::Index Index;
    eigen_assert(m.rows()==m.cols());
    Index size = m.rows();
    if(size<32)
      return unblocked(m);

    Index blockSize = size/8;
    blockSize = (blockSize/16)*16;
    blockSize = (std::min)((std::max)(blockSize,Index(8)), Index(128));

    for (Index k=0; k<size; k+=blockSize)
    {
      // partition the matrix:
      //       A00 |  -  |  -
      // lu  = A10 | A11 |  -
      //       A20 | A21 | A22
      Index bs = (std::min)(blockSize, size-k);
      Index rs = size - k - bs;
      Block<MatrixType,Dynamic,Dynamic> A11(m,k,   k,   bs,bs);
      Block<MatrixType,Dynamic,Dynamic> A21(m,k+bs,k,   rs,bs);
      Block<MatrixType,Dynamic,Dynamic> A22(m,k+bs,k+bs,rs,rs);

      Index ret;
      if((ret=unblocked(A11))>=0) return k+ret;
      if(rs>0) A11.adjoint().template triangularView<Upper>().template solveInPlace<OnTheRight>(A21);
      if(rs>0) A22.template selfadjointView<Lower>().rankUpdate(A21,-1); // bottleneck
    }
    return -1;
  }